

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O2

void mct_encode(int *c0,int *c1,int *c2,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)n;
  if (n < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = c0[uVar4];
    iVar2 = c1[uVar4];
    iVar3 = c2[uVar4];
    c0[uVar4] = iVar1 + iVar2 * 2 + iVar3 >> 2;
    c1[uVar4] = iVar3 - iVar2;
    c2[uVar4] = iVar1 - iVar2;
  }
  return;
}

Assistant:

void mct_encode(
		int* restrict c0,
		int* restrict c1,
		int* restrict c2,
		int n)
{
	int i;
	for(i = 0; i < n; ++i) {
		int r = c0[i];
		int g = c1[i];
		int b = c2[i];
		int y = (r + (g * 2) + b) >> 2;
		int u = b - g;
		int v = r - g;
		c0[i] = y;
		c1[i] = u;
		c2[i] = v;
	}
}